

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptArray::GetPropertyBuiltIns(JavascriptArray *this,PropertyId propertyId,Var *value)

{
  uint32 nValue;
  ScriptContext *scriptContext;
  Var pvVar1;
  Var *value_local;
  PropertyId propertyId_local;
  JavascriptArray *this_local;
  
  if (propertyId == 0xd1) {
    nValue = ArrayObject::GetLength(&this->super_ArrayObject);
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    pvVar1 = JavascriptNumber::ToVar(nValue,scriptContext);
    *value = pvVar1;
  }
  this_local._4_4_ = (uint)(propertyId == 0xd1);
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptArray::GetPropertyBuiltIns(PropertyId propertyId, Var* value)
    {
        //
        // length being accessed. Return array length
        //
        if (propertyId == PropertyIds::length)
        {
            *value = JavascriptNumber::ToVar(this->GetLength(), GetScriptContext());
            return true;
        }

        return false;
    }